

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Style.cpp
# Opt level: O0

void __thiscall
Style::Style::parseFields
          (Style *this,xml_node<char> *def,
          unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
          *fields)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  logic_error *plVar4;
  ostream *poVar5;
  pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>
  local_1b8;
  allocator<char> local_131;
  undefined1 local_130 [8];
  string attrVal;
  undefined1 local_108 [8];
  string attrName;
  xml_attribute<char> *attr;
  Field field;
  string local_78;
  undefined1 local_58 [8];
  u16string name;
  xml_node<char> *local_28;
  xml_node<char> *node;
  unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
  *fields_local;
  xml_node<char> *def_local;
  Style *this_local;
  
  local_28 = rapidxml::xml_node<char>::first_node(def,(char *)0x0,0,true);
  while( true ) {
    if (local_28 == (xml_node<char> *)0x0) {
      return;
    }
    pcVar3 = rapidxml::xml_base<char>::name(&local_28->super_xml_base<char>);
    iVar2 = strcmp(pcVar3,"bcf:field");
    if (iVar2 != 0) break;
    pcVar3 = rapidxml::xml_base<char>::value(&local_28->super_xml_base<char>);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,pcVar3,
               (allocator<char> *)(field.pattern.field_2._M_local_buf + 0xf));
    UtfHandler::utf8to16((u16string *)local_58,&this->utf,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)(field.pattern.field_2._M_local_buf + 0xf));
    Field::Field((Field *)&attr,(u16string *)local_58);
    for (attrName.field_2._8_8_ =
              rapidxml::xml_node<char>::first_attribute(local_28,(char *)0x0,0,true);
        attrName.field_2._8_8_ != 0;
        attrName.field_2._8_8_ =
             (size_type)
             rapidxml::xml_attribute<char>::next_attribute
                       (attrName.field_2._8_8_,(char *)0x0,0,true)) {
      pcVar3 = rapidxml::xml_base<char>::name((xml_base<char> *)attrName.field_2._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_108,pcVar3,(allocator<char> *)(attrVal.field_2._M_local_buf + 0xf))
      ;
      std::allocator<char>::~allocator((allocator<char> *)(attrVal.field_2._M_local_buf + 0xf));
      pcVar3 = rapidxml::xml_base<char>::value((xml_base<char> *)attrName.field_2._8_8_);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_130,pcVar3,&local_131);
      std::allocator<char>::~allocator(&local_131);
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_108,"fieldtype");
      if (bVar1) {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_130,"field");
        if (bVar1) {
          field.name.field_2._8_4_ = 0;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_130,"list");
          if (!bVar1) {
            plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar4,"Unexpected result");
            __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          field.name.field_2._8_4_ = 1;
        }
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_108,"datatype");
        if (bVar1) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_130,"literal");
          if (bVar1) {
            field.type = Field;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_130,"name");
            if (bVar1) {
              field.type = List;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_130,"key");
              if (bVar1) {
                field.type = 2;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_130,"entrykey");
                if (bVar1) {
                  field.type = 3;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_130,"date");
                  if (bVar1) {
                    field.type = 4;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_130,"verbatim");
                    if (bVar1) {
                      field.type = 5;
                    }
                    else {
                      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)local_130,"integer");
                      if (bVar1) {
                        field.type = 6;
                      }
                      else {
                        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)local_130,"range");
                        if (bVar1) {
                          field.type = 7;
                        }
                        else {
                          bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_130,"code");
                          if (bVar1) {
                            field.type = 8;
                          }
                          else {
                            bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_130,"uri");
                            if (bVar1) {
                              field.type = 9;
                            }
                            else {
                              bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_130,"datepart");
                              if (bVar1) {
                                field.type = 10;
                              }
                              else {
                                bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_130,"keyword");
                                if (bVar1) {
                                  field.type = 0xb;
                                }
                                else {
                                  bVar1 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_130,"option");
                                  if (bVar1) {
                                    field.type = 0xc;
                                  }
                                  else {
                                    poVar5 = std::operator<<((ostream *)&std::cerr,
                                                             "Unhandled datatype ");
                                    poVar5 = std::operator<<(poVar5,(string *)local_130);
                                    std::operator<<(poVar5,"\n");
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_108,"format");
          if (bVar1) {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_130,"xsv");
            if (bVar1) {
              field.name.field_2._12_4_ = 1;
            }
            else {
              poVar5 = std::operator<<((ostream *)&std::cerr,"Unhandled format ");
              poVar5 = std::operator<<(poVar5,(string *)local_130);
              std::operator<<(poVar5,"\n");
              field.name.field_2._12_4_ = 2;
            }
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)local_108,"nullok");
            if (bVar1) {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_130,"true");
              if (bVar1) {
                field.format._0_1_ = XSV;
              }
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_108,"skip_out");
              if (bVar1) {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_130,"true");
                if (bVar1) {
                  field.format._1_1_ = 1;
                }
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)local_108,"label");
                if ((bVar1) &&
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)local_130,"true"), bVar1)) {
                  field.format._2_1_ = 1;
                }
              }
            }
          }
        }
      }
      std::__cxx11::string::~string((string *)local_130);
      std::__cxx11::string::~string((string *)local_108);
    }
    std::
    pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>
    ::
    pair<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_&,_Style::Field_&,_true>
              (&local_1b8,
               (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
               local_58,(Field *)&attr);
    std::
    unordered_map<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field,_std::hash<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::equal_to<std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>_>_>
    ::insert(fields,&local_1b8);
    std::
    pair<const_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>,_Style::Field>
    ::~pair(&local_1b8);
    Field::~Field((Field *)&attr);
    std::__cxx11::u16string::~u16string((u16string *)local_58);
    local_28 = rapidxml::xml_node<char>::next_sibling(local_28,(char *)0x0,0,true);
  }
  plVar4 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar4,"Unexpected node name");
  __cxa_throw(plVar4,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void Style::parseFields (xml_node<> *def, unordered_map<u16string, Field> &fields) {
    for (xml_node<> *node = def->first_node(); node; node = node->next_sibling()) {
        EXPECT_NAME(node, "bcf:field");

        u16string name = utf.utf8to16(node->value());
        Field field { name };

        for (xml_attribute<> *attr = node->first_attribute(); attr; attr = attr->next_attribute()) {
            string attrName = attr->name();
            string attrVal = attr->value();

            if (attrName == "fieldtype") {
                if (attrVal == "field") {
                    field.type = Field::Type::Field;
                } else {
                    ASSERT(attrVal == "list");
                    field.type = Field::Type::List;
                }
            } else if (attrName == "datatype") {
                if (attrVal == "literal") {
                    field.dataType = Field::Data::Literal;
                } else if (attrVal == "name") {
                    field.dataType = Field::Data::Name;
                } else if (attrVal == "key") {
                    field.dataType = Field::Data::Key;
                } else if (attrVal == "entrykey") {
                    field.dataType = Field::Data::EntryKey;
                } else if (attrVal == "date") {
                    field.dataType = Field::Data::Date;
                } else if (attrVal == "verbatim") {
                    field.dataType = Field::Data::Verbatim;
                } else if (attrVal == "integer") {
                    field.dataType = Field::Data::Integer;
                } else if (attrVal == "range") {
                    field.dataType = Field::Data::Range;
                } else if (attrVal == "code") {
                    field.dataType = Field::Data::Code;
                } else if (attrVal == "uri") {
                    field.dataType = Field::Data::URI;
                } else if (attrVal == "datepart") {
                    field.dataType = Field::Data::Datepart;
                } else if (attrVal == "keyword") {
                    field.dataType = Field::Data::Keyword;
                } else if (attrVal == "option") {
                    field.dataType = Field::Data::Option;
                } else {
                    std::cerr << "Unhandled datatype " << attrVal << "\n";
                }
            } else if (attrName == "format") {
                if (attrVal == "xsv") {
                    field.format = Field::Format::XSV;
                } else {
                    std::cerr << "Unhandled format " << attrVal << "\n";
                    field.format = Field::Format::Other;
                }
            } else if (attrName == "nullok") {
                // NOTE: Technically the schema does not allow any other value besides "true",
                //  so the check is useless
                if (attrVal == "true") field.nullok = true;
            } else if (attrName == "skip_out") {
                if (attrVal == "true") field.skipout = true;
            } else if (attrName == "label") {
                if (attrVal == "true") field.label = true;
            }
        }

        fields.insert({ name, field });
    }
}